

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeHandlerBase::DoShareTypeHandlerInternal<true>
          (PathTypeHandlerBase *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  uint16 uVar4;
  PropertyId propertyId;
  undefined4 *puVar5;
  TypePath *pTVar6;
  PropertyRecord *this_00;
  ushort local_1a;
  PropertyIndex index;
  ScriptContext *scriptContext_local;
  PathTypeHandlerBase *this_local;
  
  bVar2 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  if ((bVar2 & 0x1c) != 0xc) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xbf2,
                                "((GetFlags() & (IsLockedFlag | MayBecomeSharedFlag | IsSharedFlag)) == (IsLockedFlag | MayBecomeSharedFlag))"
                                ,
                                "(GetFlags() & (IsLockedFlag | MayBecomeSharedFlag | IsSharedFlag)) == (IsLockedFlag | MayBecomeSharedFlag)"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = DynamicTypeHandler::IsolatePrototypes();
  if (((bVar3) &&
      (bVar3 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler), bVar3))
     && (bVar3 = DynamicTypeHandler::GetIsPrototype(&this->super_DynamicTypeHandler), bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xbf3,
                                "(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype())"
                                ,
                                "!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype()"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = FixPropsOnPathTypes();
  if (bVar3) {
    pTVar6 = GetTypePath(this);
    bVar2 = TypePath::GetMaxInitializedLength(pTVar6);
    uVar4 = GetPathLength(this);
    if (bVar2 < uVar4) {
      pTVar6 = GetTypePath(this);
      uVar4 = GetPathLength(this);
      TypePath::SetMaxInitializedLength(pTVar6,(uint)uVar4);
    }
    for (local_1a = 0; uVar4 = GetPathLength(this), local_1a < uVar4; local_1a = local_1a + 1) {
      pTVar6 = GetTypePath(this);
      this_00 = TypePath::GetPropertyIdUnchecked(pTVar6,(uint)local_1a);
      propertyId = PropertyRecord::GetPropertyId(this_00);
      InvalidateFixedFieldAt(this,propertyId,local_1a,scriptContext);
    }
    bVar3 = HasOnlyInitializedNonFixedProperties(this);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xc06,"(HasOnlyInitializedNonFixedProperties())",
                                  "HasOnlyInitializedNonFixedProperties()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar3 = HasSingletonInstanceOnlyIfNeeded(this);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xc07,"(HasSingletonInstanceOnlyIfNeeded())",
                                  "HasSingletonInstanceOnlyIfNeeded()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar3 = HasSingletonInstance(this);
    if (bVar3) {
      pTVar6 = GetTypePath(this);
      TypePath::ClearSingletonInstance(pTVar6);
    }
  }
  return;
}

Assistant:

void PathTypeHandlerBase::DoShareTypeHandlerInternal(ScriptContext* scriptContext)
    {
        Assert((GetFlags() & (IsLockedFlag | MayBecomeSharedFlag | IsSharedFlag)) == (IsLockedFlag | MayBecomeSharedFlag));
        Assert(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype());

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        // If this handler is becoming shared we need to remove the singleton instance (so that it can be collected
        // if no longer referenced by anything else) and invalidate any fixed fields.
        if (FixPropsOnPathTypes())
        {
            if (invalidateFixedFields)
            {
                if (this->GetTypePath()->GetMaxInitializedLength() < GetPathLength())
                {
                    this->GetTypePath()->SetMaxInitializedLength(GetPathLength());
                }
                for (PropertyIndex index = 0; index < this->GetPathLength(); index++)
                {
                    InvalidateFixedFieldAt(this->GetTypePath()->GetPropertyIdUnchecked(index)->GetPropertyId(), index, scriptContext);
                }
            }

            Assert(HasOnlyInitializedNonFixedProperties());
            Assert(HasSingletonInstanceOnlyIfNeeded());
            if (HasSingletonInstance())
            {
                this->GetTypePath()->ClearSingletonInstance();
            }
        }
#endif
    }